

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void __thiscall baryonyx::context::context(context *this,int verbose_level)

{
  message_type mVar1;
  int verbose_level_local;
  context *this_local;
  
  solver_parameters::solver_parameters(&this->parameters);
  std::__cxx11::string::string((string *)&this->method);
  std::function<void_(const_baryonyx::solver_parameters_&)>::function(&this->start);
  std::function<void_(int,_double,_long,_double,_long)>::function(&this->update);
  std::function<void_(const_baryonyx::result_&)>::function(&this->finish);
  mVar1 = convert_verbose_level(verbose_level);
  this->log_priority = mVar1;
  return;
}

Assistant:

context(int verbose_level = 6)
      : log_priority(convert_verbose_level(verbose_level))
    {}